

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O0

double TasGrid::RuleLocal::diffPWPower<(TasGrid::RuleLocal::erule)1>
                 (int max_order,int point,double x)

{
  double dVar1;
  int *piVar2;
  size_type __n;
  reference pvVar3;
  double dVar4;
  int local_cc;
  value_type vStack_c8;
  int j_1;
  double derivative;
  double right_prod;
  double dStack_b0;
  int j;
  double coeff;
  double node;
  allocator<double> local_89;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> left_prods;
  anon_class_24_3_cb42508a rollback_and_get_prev_node;
  anon_class_24_3_cb42508a update_and_get_next_node;
  double phantom_distance;
  int most_turns;
  int local_28;
  int local_24;
  int max_ancestors;
  int level;
  double x_local;
  int point_local;
  int max_order_local;
  
  _max_ancestors = x;
  x_local._0_4_ = point;
  x_local._4_4_ = max_order;
  if (point < 9) {
    _point_local = diffPWCubic<(TasGrid::RuleLocal::erule)1>(point,x);
  }
  else {
    local_24 = getLevel<(TasGrid::RuleLocal::erule)1>(point);
    _most_turns = &local_24;
    local_28 = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_8_1_a83b8aa4::operator()
                         ((anon_class_8_1_a83b8aa4 *)&most_turns);
    if (0 < x_local._4_4_) {
      phantom_distance._4_4_ = x_local._4_4_ + -2;
      piVar2 = std::min<int>(&local_28,(int *)((long)&phantom_distance + 4));
      local_28 = *piVar2;
    }
    phantom_distance._0_4_ = 1;
    update_and_get_next_node.point = (int *)0x3ff0000000000000;
    left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = &phantom_distance;
    rollback_and_get_prev_node.most_turns = (int *)&update_and_get_next_node.point;
    rollback_and_get_prev_node.phantom_distance = &x_local;
    __n = (size_type)local_28;
    rollback_and_get_prev_node.point =
         (int *)left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    update_and_get_next_node.most_turns = rollback_and_get_prev_node.most_turns;
    update_and_get_next_node.phantom_distance = rollback_and_get_prev_node.phantom_distance;
    ::std::allocator<double>::allocator(&local_89);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_88,__n,&local_89);
    ::std::allocator<double>::~allocator(&local_89);
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,0);
    *pvVar3 = 1.0;
    coeff = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                      ((anon_class_24_3_cb42508a *)&rollback_and_get_prev_node.point);
    dStack_b0 = 1.0 / -coeff;
    for (right_prod._4_4_ = 1; right_prod._4_4_ < local_28; right_prod._4_4_ = right_prod._4_4_ + 1)
    {
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,
                          (long)(right_prod._4_4_ + -1));
      dVar1 = *pvVar3;
      dVar4 = _max_ancestors - coeff;
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,(long)right_prod._4_4_
                         );
      *pvVar3 = dVar1 * dVar4;
      coeff = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                        ((anon_class_24_3_cb42508a *)&rollback_and_get_prev_node.point);
      dStack_b0 = (1.0 / -coeff) * dStack_b0;
    }
    derivative = 1.0;
    pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_88,(long)(local_28 + -1));
    vStack_c8 = *pvVar3;
    for (local_cc = local_28 + -2; -1 < local_cc; local_cc = local_cc + -1) {
      derivative = derivative * (_max_ancestors - coeff);
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_88,(long)local_cc);
      vStack_c8 = derivative * *pvVar3 + vStack_c8;
      coeff = diffPWPower<(TasGrid::RuleLocal::erule)1>::anon_class_24_3_cb42508a::operator()
                        ((anon_class_24_3_cb42508a *)
                         &left_prods.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    }
    _point_local = dStack_b0 *
                   (vStack_c8 * (1.0 - _max_ancestors) * (_max_ancestors + 1.0) +
                   derivative * (_max_ancestors - coeff) * -2.0 * _max_ancestors);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_88);
  }
  return _point_local;
}

Assistant:

double diffPWPower(int max_order, int point, double x) {
        // use the cubic implementation until we have enough points
        if (effrule == erule::localp     and point <= 8) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::semilocalp and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localpb    and point <= 4) return diffPWCubic<effrule>(point, x);
        if (effrule == erule::localp0    and point <= 2) return diffPWCubic<effrule>(point, x);
        int level = getLevel<effrule>(point);
        int max_ancestors = [&]()->int {
            switch(effrule) {
                case erule::pwc:        return 0;
                case erule::localp:     return level - 2;
                case erule::semilocalp:
                case erule::localpb:    return level - 1;
                default:                return level;
            };
        }();

        if (max_order > 0) max_ancestors = std::min(max_ancestors, max_order - 2);

        // This lambda captures most_turns and phantom_distance by reference, uses those as internal state variables, and on each
        // call it returns the next normalized ancestor node.
        int most_turns = 1;
        double phantom_distance = 1.0;
        auto update_and_get_next_node = [&]() {
            most_turns *= 2;
            phantom_distance = 2.0 * phantom_distance + 1.0;
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // This lambda is the inverse transform of update_and_get_next_node() above, and returns the previous descendant node.
        auto rollback_and_get_prev_node = [&]() {
            most_turns /= 2;
            phantom_distance = 0.5 * (phantom_distance - 1.0);
            int turns = (effrule == erule::localp0) ? ((point+1) % most_turns) : ((point-1) % most_turns);
            return (turns < most_turns / 2) ?
                    (phantom_distance - 2.0 * ((double) turns)) :
                    (-phantom_distance + 2.0 * ((double) (most_turns - 1 - turns)));
        };

        // Does not include the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        std::vector<double> left_prods(max_ancestors);
        left_prods[0] = 1.0;
        double node = update_and_get_next_node();
        double coeff = 1.0 / (-node);
        for(int j=1; j<max_ancestors; j++) {
            left_prods[j] = left_prods[j-1] * (x - node);
            node = update_and_get_next_node();
            coeff *= 1.0 / (-node);
        }
        double right_prod = 1.0;
        double derivative = left_prods[max_ancestors-1];
        for (int j=max_ancestors-2; j>=0; j--) {
            right_prod *= x - node;
            derivative += right_prod * left_prods[j];
            node = rollback_and_get_prev_node();
        }

        // Adjust for the additional factor (1-x) * (1+x) and the Lagrange coefficient.
        derivative = derivative * (1.0 - x) * (1.0 + x) + right_prod * (x - node) * (-2.0) * x;
        derivative *= coeff;

        return derivative;
    }